

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateDefinition.cpp
# Opt level: O0

void __thiscall
Shell::PredicateDefinition::PredData::add
          (PredData *this,int polarity,int add,PredicateDefinition *pdObj)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  PredicateDefinition *in_stack_00000038;
  PredData *in_stack_00000040;
  
  if (in_ESI == -1) {
    *(int *)(in_RDI + 0x34) = in_EDX + *(int *)(in_RDI + 0x34);
  }
  else if (in_ESI == 0) {
    *(int *)(in_RDI + 0x38) = in_EDX + *(int *)(in_RDI + 0x38);
  }
  else if (in_ESI == 1) {
    *(int *)(in_RDI + 0x30) = in_EDX + *(int *)(in_RDI + 0x30);
  }
  if (in_EDX == -1) {
    check(in_stack_00000040,in_stack_00000038);
  }
  return;
}

Assistant:

void add(int polarity, int add, PredicateDefinition* pdObj)
  {
    switch (polarity) {
    case -1:
      nocc += add;
      break;
    case 0:
      docc += add;
      break;
    case 1:
      pocc += add;
      break;
#if VDEBUG
    default:
      ASSERTION_VIOLATION;
      return;
#endif
    }
    if(add==-1) {
      check(pdObj);
    }
  }